

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSSBOLayoutCase.cpp
# Opt level: O0

BufferBlock * __thiscall
deqp::gles31::bb::ShaderInterface::allocBlock(ShaderInterface *this,char *name)

{
  size_type sVar1;
  BufferBlock *this_00;
  reference ppBVar2;
  vector<deqp::gles31::bb::BufferBlock_*,_std::allocator<deqp::gles31::bb::BufferBlock_*>_> *this_01
  ;
  BufferBlock *local_20;
  char *local_18;
  char *name_local;
  ShaderInterface *this_local;
  
  this_01 = &this->m_bufferBlocks;
  local_18 = name;
  name_local = (char *)this;
  sVar1 = std::
          vector<deqp::gles31::bb::BufferBlock_*,_std::allocator<deqp::gles31::bb::BufferBlock_*>_>
          ::size(this_01);
  std::vector<deqp::gles31::bb::BufferBlock_*,_std::allocator<deqp::gles31::bb::BufferBlock_*>_>::
  reserve(this_01,sVar1 + 1);
  this_00 = (BufferBlock *)operator_new(0x80);
  BufferBlock::BufferBlock(this_00,local_18);
  local_20 = this_00;
  std::vector<deqp::gles31::bb::BufferBlock_*,_std::allocator<deqp::gles31::bb::BufferBlock_*>_>::
  push_back(this_01,&local_20);
  ppBVar2 = std::
            vector<deqp::gles31::bb::BufferBlock_*,_std::allocator<deqp::gles31::bb::BufferBlock_*>_>
            ::back(&this->m_bufferBlocks);
  return *ppBVar2;
}

Assistant:

BufferBlock& ShaderInterface::allocBlock (const char* name)
{
	m_bufferBlocks.reserve(m_bufferBlocks.size()+1);
	m_bufferBlocks.push_back(new BufferBlock(name));
	return *m_bufferBlocks.back();
}